

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O1

bool dg::pta::PointerAnalysisFS::mergeObjects
               (PSNode *node,MemoryObject *to,MemoryObject *from,PointsToSetT *overwritten)

{
  undefined8 *puVar1;
  _Base_ptr p_Var2;
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  *this;
  bool bVar3;
  IDTy i;
  mapped_type *this_00;
  _Base_ptr p_Var4;
  byte bVar5;
  bool bVar6;
  const_iterator __begin3;
  const_iterator local_78;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_60;
  PointsToMapT *local_58;
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  *local_50;
  _Rb_tree_node_base *local_48;
  Pointer local_40;
  
  p_Var4 = (from->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_48 = &(from->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var4 == local_48) {
    bVar6 = false;
  }
  else {
    local_58 = &to->pointsTo;
    bVar6 = false;
    local_60._M_cur = (__node_type *)node;
    local_50 = &overwritten->pointers;
    do {
      this = local_50;
      if (local_50 ==
          (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
           *)0x0) {
LAB_0011052b:
        this_00 = std::
                  map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
                  ::operator[](local_58,(key_type *)(p_Var4 + 1));
        local_78.container_it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
             (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
             p_Var4[1]._M_right;
        local_78.container_end.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
             (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
             (__node_type *)0x0;
        local_78.pos = 0;
        if (*(long *)(p_Var4 + 2) != 0) {
          p_Var2 = *(_Base_ptr *)
                    ((long)&(((__node_type *)
                             local_78.container_it.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                             ._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                            ._M_storage._M_storage + 8);
          if (((ulong)p_Var2 & 1) == 0) {
            local_78.pos = 0;
            do {
              if (local_78.pos == 0x3f) {
                local_78.pos = 0x40;
                break;
              }
              bVar5 = (byte)local_78.pos;
              local_78.pos = local_78.pos + 1;
            } while (((ulong)p_Var2 >> (bVar5 & 0x3f) & 2) == 0);
          }
          else {
            local_78.pos = 0;
          }
        }
        if (local_78.pos != 0 ||
            local_78.container_it.
            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
            != (__node_type *)0x0) {
          do {
            puVar1 = (undefined8 *)
                     ((long)*(_Base_ptr *)
                             ((long)local_78.container_it.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                    ._M_cur + 8) * 0x10 + -0x10 +
                     local_78.pos * 0x10 + llvm::DisableABIBreakingChecks);
            local_40.target = (PSNode *)*puVar1;
            local_40.offset.offset = puVar1[1];
            bVar3 = PointerIdPointsToSet::add(this_00,&local_40);
            bVar6 = (bool)(bVar6 | bVar3);
            ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::const_iterator::operator++(&local_78);
          } while (local_78.container_it.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                   _M_cur != (__node_type *)0x0 || local_78.pos != 0);
        }
      }
      else {
        local_78.container_end.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
             *(_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)
              (p_Var4 + 1);
        local_78.container_it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
             (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
             (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
             local_60._M_cur;
        i = PointerIDLookupTable::getOrCreate
                      ((PointerIDLookupTable *)&PointerIdPointsToSet::lookupTable,
                       (Pointer *)&local_78);
        bVar3 = ADT::
                SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                ::get(this,i);
        if (!bVar3) goto LAB_0011052b;
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != local_48);
  }
  return bVar6;
}

Assistant:

static bool mergeObjects(PSNode *node, MemoryObject *to, MemoryObject *from,
                             PointsToSetT *overwritten) {
        bool changed = false;

        for (auto &fromIt : from->pointsTo) {
            if (overwritten && overwritten->count(Pointer(node, fromIt.first)))
                continue;

            auto &S = to->pointsTo[fromIt.first];
            for (const auto &ptr : fromIt.second)
                changed |= S.add(ptr);
        }

        return changed;
    }